

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

void __thiscall net_uv::Server::~Server(Server *this)

{
  Server *this_local;
  
  (this->super_Runnable)._vptr_Runnable = (_func_int **)&PTR__Server_00210a10;
  (this->super_SessionManager)._vptr_SessionManager = (_func_int **)&PTR__Server_00210a90;
  std::__cxx11::string::~string((string *)&this->m_ip);
  std::function<void_(net_uv::Server_*,_net_uv::Session_*)>::~function(&this->m_disconnectCall);
  std::function<void_(net_uv::Server_*,_net_uv::Session_*,_char_*,_unsigned_int)>::~function
            (&this->m_recvCall);
  std::function<void_(net_uv::Server_*,_net_uv::Session_*)>::~function(&this->m_newConnectCall);
  std::function<void_(net_uv::Server_*)>::~function(&this->m_closeCall);
  SessionManager::~SessionManager(&this->super_SessionManager);
  Runnable::~Runnable(&this->super_Runnable);
  return;
}

Assistant:

Server::~Server()
{}